

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O0

bool __thiscall
CS248::GLResourceManager::createVertexShader
          (GLResourceManager *this,char *source_code,ShaderId *out_sid)

{
  bool bVar1;
  ostream *this_00;
  ShaderId *in_RSI;
  undefined8 in_RDI;
  char *unaff_retaddr;
  bool success;
  
  bVar1 = anon_unknown_10::createShaderOfType(unaff_retaddr,(GLenum)((ulong)in_RDI >> 0x20),in_RSI);
  if (!bVar1) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Above Errors are for vertex shader");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return bVar1;
}

Assistant:

bool GLResourceManager::createVertexShader(const char* source_code, ShaderId* out_sid) {
  bool success = createShaderOfType(source_code, GL_VERTEX_SHADER, out_sid);
  if (!success) {
    cerr << "Above Errors are for vertex shader" << endl;
  }
  return success;
}